

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall
ON_SurfaceCurvatureColorMapping::Hash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SurfaceCurvatureColorMapping *this)

{
  undefined8 uVar1;
  bool bVar2;
  ON_UUID uniqueness_boost;
  ON_SHA1 sha1;
  
  bVar2 = IsSet(this);
  if (bVar2) {
    ON_SHA1::ON_SHA1(&sha1);
    uniqueness_boost.Data1 = 0x639e9144;
    uniqueness_boost.Data2 = 0x1c1a;
    uniqueness_boost.Data3 = 0x4bba;
    uniqueness_boost.Data4[0] = 0x82;
    uniqueness_boost.Data4[1] = 'H';
    uniqueness_boost.Data4[2] = 0xd3;
    uniqueness_boost.Data4[3] = '0';
    uniqueness_boost.Data4[4] = 0xf5;
    uniqueness_boost.Data4[5] = '\r';
    uniqueness_boost.Data4[6] = '{';
    uniqueness_boost.Data4[7] = 'i';
    ON_SHA1::AccumulateId(&sha1,&uniqueness_boost);
    ON_SHA1::AccumulateInteger32(&sha1,this->m_kappa_style);
    ON_SHA1::AccumulateDoubleArray(&sha1,2,(this->m_kappa_range).m_t);
    ON_SHA1::AccumulateDoubleArray(&sha1,2,(this->m_hue_range_in_radians).m_t);
    ON_SHA1::Hash(__return_storage_ptr__,&sha1);
  }
  else {
    *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)__return_storage_ptr__->m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)(__return_storage_ptr__->m_digest + 8) = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SurfaceCurvatureColorMapping::Hash() const
{
  if (this->IsSet())
  {
    ON_SHA1 sha1;

    // The uuid is accumulated because an int,double,double could easily
    // be the intput data int many unrelated contexts. This sha1 is used
    // to avoid expensive recalculations of curvatures and their false colors.
    const ON_UUID uniqueness_boost = ON_SurfaceCurvatureColorMapping::Id;
    sha1.AccumulateId(uniqueness_boost);

    const unsigned u = (unsigned)this->m_kappa_style;
    sha1.AccumulateInteger32(u);

    sha1.AccumulateDoubleArray(2, this->m_kappa_range.m_t);

    sha1.AccumulateDoubleArray(2, this->m_hue_range_in_radians.m_t);

    return sha1.Hash();
  }
  return ON_SHA1_Hash::EmptyContentHash;
}